

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test9::verifyXFBData
          (GPUShaderFP64Test9 *this,_test_case *test_case,uchar *xfb_data)

{
  int *value;
  size_type *this_00;
  _variable_type _Var1;
  _operation_type _Var2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  _variable_type _Var7;
  uint uVar8;
  ostream *poVar9;
  MessageBuilder *pMVar10;
  TestError *this_01;
  _variable_type *matrix_b_type;
  GPUShaderFP64Test9 *pGVar11;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type type_04;
  _variable_type type_05;
  _variable_type type_06;
  uint n_logged_component;
  GPUShaderFP64Test9 *pGVar12;
  int iVar13;
  GPUShaderFP64Test9 *pGVar14;
  int iVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  _variable_type matrix_a_type;
  vector<double,_std::allocator<double>_> reference2;
  vector<double,_std::allocator<double>_> reference1;
  string local_3d8;
  double expected_result_data [16];
  string operation_type_string;
  stringstream log_sstream;
  ostringstream local_1b0 [8];
  ostream local_1a8;
  
  uVar5 = Utils::getNumberOfComponentsForVariableType(test_case->result_variable_type);
  pGVar14 = (GPUShaderFP64Test9 *)(ulong)uVar5;
  reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar6 = test_case->operation_type - OPERATION_TYPE_PRE_DECREMENTATION;
  iVar13 = 0;
  if (uVar6 < 4) {
    iVar13 = *(int *)(&DAT_016952a0 + (ulong)uVar6 * 4);
  }
  _Var1 = test_case->variable_type;
  if ((_Var1 < VARIABLE_TYPE_UINT) && ((0x7fc03fe0U >> (_Var1 & VARIABLE_TYPE_UINT) & 1) != 0)) {
    _Var7 = Utils::getTransposedMatrixVariableType(_Var1);
    uVar8 = Utils::getNumberOfComponentsForVariableType(_Var1);
    uVar6 = Utils::getNumberOfComponentsForVariableType(_Var7);
    iVar15 = iVar13;
    while( true ) {
      iVar15 = iVar15 + 1;
      bVar16 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar16) break;
      _log_sstream = (TestLog *)(double)iVar15;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&reference1,(double *)&log_sstream);
    }
    while (uVar6 = uVar6 - 1, uVar6 != 0xffffffff) {
      _log_sstream = (TestLog *)(double)uVar6;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&reference2,(double *)&log_sstream);
    }
  }
  else {
    uVar6 = uVar5;
    iVar15 = iVar13;
    while( true ) {
      iVar15 = iVar15 + 1;
      uVar6 = uVar6 - 1;
      if (uVar6 == 0xffffffff) break;
      _log_sstream = (TestLog *)(double)iVar15;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&reference1,(double *)&log_sstream);
      _log_sstream = (TestLog *)(double)uVar6;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&reference2,(double *)&log_sstream);
    }
  }
  _Var2 = test_case->operation_type;
  if (((_Var2 == OPERATION_TYPE_MULTIPLICATION) &&
      (_Var1 = test_case->variable_type, _Var1 < VARIABLE_TYPE_UINT)) &&
     (matrix_b_type = (_variable_type *)0x7fc03fe0,
     (0x7fc03fe0U >> (_Var1 & VARIABLE_TYPE_UINT) & 1) != 0)) {
    pGVar11 = (GPUShaderFP64Test9 *)(ulong)_Var1;
    matrix_a_type = _Var1;
    _Var7 = Utils::getTransposedMatrixVariableType(_Var1);
    pGVar12 = (GPUShaderFP64Test9 *)&matrix_a_type;
    getMatrixMultiplicationResult
              (pGVar11,(_variable_type *)pGVar12,&reference1,matrix_b_type,&reference2,
               expected_result_data);
    pGVar11 = (GPUShaderFP64Test9 *)0xffffffffffffffff;
    do {
      if ((long)pGVar11 - (long)pGVar14 == -1) goto LAB_009f1599;
      dVar17 = *(double *)(xfb_data + (long)pGVar11 * 8 + 8) -
               expected_result_data
               [(long)((long)&(pGVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode
                      + 1)];
      dVar18 = -dVar17;
      if (-dVar17 <= dVar17) {
        dVar18 = dVar17;
      }
      pGVar11 = (GPUShaderFP64Test9 *)
                ((long)&(pGVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
    } while (dVar18 <= 1e-05);
    bVar16 = pGVar14 <= pGVar11;
    std::__cxx11::stringstream::stringstream((stringstream *)&log_sstream);
    poVar9 = std::operator<<(&local_1a8,"Data returned for ");
    Utils::getVariableTypeString_abi_cxx11_(&operation_type_string,(Utils *)(ulong)_Var1,type);
    poVar9 = std::operator<<(poVar9,(string *)&operation_type_string);
    poVar9 = std::operator<<(poVar9," * ");
    Utils::getVariableTypeString_abi_cxx11_(&local_3d8,(Utils *)(ulong)_Var7,type_00);
    poVar9 = std::operator<<(poVar9,(string *)&local_3d8);
    std::operator<<(poVar9," matrix multiplication was incorrect; expected:(");
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&operation_type_string);
    for (pGVar12 = (GPUShaderFP64Test9 *)0x0; pGVar14 != pGVar12;
        pGVar12 = (GPUShaderFP64Test9 *)
                  ((long)&(pGVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1
                  )) {
      std::ostream::_M_insert<double>(expected_result_data[(long)pGVar12]);
      if ((GPUShaderFP64Test9 *)(ulong)(uVar5 - 1) != pGVar12) {
        std::operator<<(&local_1a8,", ");
      }
    }
    std::operator<<(&local_1a8,"), retrieved:(");
    for (pGVar12 = (GPUShaderFP64Test9 *)0x0; pGVar14 != pGVar12;
        pGVar12 = (GPUShaderFP64Test9 *)
                  ((long)&(pGVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1
                  )) {
      std::ostream::_M_insert<double>(*(double *)(xfb_data + (long)pGVar12 * 8));
      if ((GPUShaderFP64Test9 *)(ulong)(uVar5 - 1) != pGVar12) {
        std::operator<<(&local_1a8,", ");
      }
    }
    std::operator<<(&local_1a8,")");
    operation_type_string._M_dataplus._M_p =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &operation_type_string._M_string_length;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)this_00,local_3d8._M_dataplus._M_p);
    pGVar12 = (GPUShaderFP64Test9 *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&operation_type_string,(EndMessageToken *)&tcu::TestLog::EndMessage
              );
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    std::__cxx11::stringstream::~stringstream((stringstream *)&log_sstream);
  }
  else {
    pGVar12 = (GPUShaderFP64Test9 *)0x0;
    do {
      if (pGVar14 == pGVar12) goto LAB_009f1599;
      if (OPERATION_TYPE_POST_INCREMENTATION < _Var2) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unrecognized operation type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x2e6e);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      dVar18 = reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pGVar12];
      switch(_Var2) {
      case OPERATION_TYPE_ADDITION:
        dVar18 = dVar18 + reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pGVar12];
        break;
      case OPERATION_TYPE_DIVISION:
        dVar18 = dVar18 / reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pGVar12];
        break;
      case OPERATION_TYPE_MULTIPLICATION:
        dVar18 = dVar18 * reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pGVar12];
        break;
      case OPERATION_TYPE_SUBTRACTION:
        dVar18 = dVar18 - reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)pGVar12];
        break;
      case OPERATION_TYPE_POST_DECREMENTATION:
      case OPERATION_TYPE_POST_INCREMENTATION:
        dVar18 = dVar18 - (double)iVar13;
      }
      dVar18 = *(double *)(xfb_data + (long)pGVar12 * 8) - dVar18;
      dVar17 = -dVar18;
      if (-dVar18 <= dVar18) {
        dVar17 = dVar18;
      }
      pGVar12 = (GPUShaderFP64Test9 *)
                ((long)&(pGVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1);
    } while (dVar17 <= 1e-05);
    getOperationTypeString_abi_cxx11_(&operation_type_string,pGVar12,&test_case->operation_type);
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)expected_result_data,(Utils *)(ulong)test_case->variable_type,type_01);
    _log_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,"Value(s) generated for variable type [");
    std::operator<<((ostream *)local_1b0,(string *)expected_result_data);
    std::operator<<((ostream *)local_1b0,"] and operation type [");
    std::operator<<((ostream *)local_1b0,(string *)&operation_type_string);
    std::operator<<((ostream *)local_1b0,"] were found invalid.");
    pGVar12 = (GPUShaderFP64Test9 *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&log_sstream,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    std::__cxx11::string::~string((string *)expected_result_data);
    std::__cxx11::string::~string((string *)&operation_type_string);
    bVar16 = false;
  }
LAB_009f166d:
  value = (int *)(xfb_data + (long)pGVar14 * 8);
  bVar4 = Utils::isScalarVariableType(test_case->variable_type);
  if (bVar4) {
    dVar18 = *reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar17 = *reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar3 = (double)(float)dVar17;
    if ((dVar18 < dVar17 == (*value == 0)) || ((value[1] == 0) == dVar18 < dVar3)) {
      getOperationTypeString_abi_cxx11_(&operation_type_string,pGVar12,&test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)expected_result_data,(Utils *)(ulong)test_case->variable_type,type_02);
      _log_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,
                      "Values reported for lower-than operator used for variable type [");
      std::operator<<((ostream *)local_1b0,(string *)expected_result_data);
      std::operator<<((ostream *)local_1b0,"]and operation type [");
      std::operator<<((ostream *)local_1b0,(string *)&operation_type_string);
      std::operator<<((ostream *)local_1b0,"]was found invalid; expected:(");
      bVar16 = SUB81(local_1b0,0);
      std::ostream::_M_insert<bool>(bVar16);
      std::operator<<((ostream *)local_1b0,", ");
      std::ostream::_M_insert<bool>(bVar16);
      std::operator<<((ostream *)local_1b0,"); found:(");
      pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&log_sstream,value);
      std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value + 1);
      std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      pGVar12 = (GPUShaderFP64Test9 *)&tcu::TestLog::EndMessage;
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
      std::__cxx11::string::~string((string *)expected_result_data);
      std::__cxx11::string::~string((string *)&operation_type_string);
      bVar16 = false;
    }
    if ((dVar17 < dVar18 == (value[2] != 0)) || (dVar3 < dVar18 == (value[3] != 0))) {
      getOperationTypeString_abi_cxx11_(&operation_type_string,pGVar12,&test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)expected_result_data,(Utils *)(ulong)test_case->variable_type,type_03);
      _log_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,
                      "Values reported for lower-than-or-equal operator used for variable type [");
      std::operator<<((ostream *)local_1b0,(string *)expected_result_data);
      std::operator<<((ostream *)local_1b0,"]and operation type [");
      std::operator<<((ostream *)local_1b0,(string *)&operation_type_string);
      std::operator<<((ostream *)local_1b0,"]was found invalid; expected:(");
      bVar16 = SUB81(local_1b0,0);
      std::ostream::_M_insert<bool>(bVar16);
      std::operator<<((ostream *)local_1b0,", ");
      std::ostream::_M_insert<bool>(bVar16);
      std::operator<<((ostream *)local_1b0,"); found:(");
      pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&log_sstream,value);
      std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value + 1);
      std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      pGVar12 = (GPUShaderFP64Test9 *)&tcu::TestLog::EndMessage;
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
      std::__cxx11::string::~string((string *)expected_result_data);
      std::__cxx11::string::~string((string *)&operation_type_string);
      bVar16 = false;
    }
    if ((dVar18 <= dVar17 == (value[4] != 0)) || (dVar18 <= dVar3 == (value[5] != 0))) {
      getOperationTypeString_abi_cxx11_(&operation_type_string,pGVar12,&test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)expected_result_data,(Utils *)(ulong)test_case->variable_type,type_04);
      _log_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,
                      "Values reported for greater-than operator used for variable type [");
      std::operator<<((ostream *)local_1b0,(string *)expected_result_data);
      std::operator<<((ostream *)local_1b0,"]and operation type [");
      std::operator<<((ostream *)local_1b0,(string *)&operation_type_string);
      std::operator<<((ostream *)local_1b0,"]was found invalid; expected:(");
      bVar16 = SUB81(local_1b0,0);
      std::ostream::_M_insert<bool>(bVar16);
      std::operator<<((ostream *)local_1b0,", ");
      std::ostream::_M_insert<bool>(bVar16);
      std::operator<<((ostream *)local_1b0,"); found:(");
      pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&log_sstream,value);
      std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value + 1);
      std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
      pGVar12 = (GPUShaderFP64Test9 *)&tcu::TestLog::EndMessage;
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
      std::__cxx11::string::~string((string *)expected_result_data);
      std::__cxx11::string::~string((string *)&operation_type_string);
      bVar16 = false;
    }
    if ((dVar18 < dVar17 != (value[6] != 0)) && (dVar18 < dVar3 != (value[7] != 0)))
    goto LAB_009f1db9;
    getOperationTypeString_abi_cxx11_(&operation_type_string,pGVar12,&test_case->operation_type);
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)expected_result_data,(Utils *)(ulong)test_case->variable_type,type_05);
    _log_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,
                    "Values reported for greater-than-or-equal operator used for variable type [");
    std::operator<<((ostream *)local_1b0,(string *)expected_result_data);
    std::operator<<((ostream *)local_1b0,"]and operation type [");
    std::operator<<((ostream *)local_1b0,(string *)&operation_type_string);
    std::operator<<((ostream *)local_1b0,"]was found invalid; expected:(");
    bVar16 = SUB81(local_1b0,0);
    std::ostream::_M_insert<bool>(bVar16);
    std::operator<<((ostream *)local_1b0,", ");
    std::ostream::_M_insert<bool>(bVar16);
    std::operator<<((ostream *)local_1b0,"); found:(");
    pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&log_sstream,value);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value + 1);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (((((*value == 1) && (value[1] == 1)) &&
         ((value[2] == 1 && ((value[3] == 1 && (value[4] == 1)))))) && (value[5] == 1)) &&
       ((value[6] == 1 && (value[7] == 1)))) goto LAB_009f1db9;
    getOperationTypeString_abi_cxx11_(&operation_type_string,pGVar12,&test_case->operation_type);
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)expected_result_data,(Utils *)(ulong)test_case->variable_type,type_06);
    _log_sstream = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,
                    "Invalid value was reported for matrix variable type, for which  operator checks are not executed; variable type ["
                   );
    std::operator<<((ostream *)local_1b0,(string *)expected_result_data);
    std::operator<<((ostream *)local_1b0,"]and operation type [");
    std::operator<<((ostream *)local_1b0,(string *)&operation_type_string);
    std::operator<<((ostream *)local_1b0,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&log_sstream,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::__cxx11::string::~string((string *)expected_result_data);
  std::__cxx11::string::~string((string *)&operation_type_string);
  bVar16 = false;
LAB_009f1db9:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&reference2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&reference1.super__Vector_base<double,_std::allocator<double>_>);
  return bVar16;
LAB_009f1599:
  bVar16 = true;
  goto LAB_009f166d;
}

Assistant:

bool GPUShaderFP64Test9::verifyXFBData(const _test_case& test_case, const unsigned char* xfb_data)
{
	const double	   epsilon = 1e-5;
	const unsigned int n_result_components =
		Utils::getNumberOfComponentsForVariableType(test_case.result_variable_type);
	bool		  result			  = true;
	const double* xfb_data_result	 = (const double*)xfb_data;
	const int*	xfb_data_result_lt  = (const int*)(xfb_data_result + n_result_components);
	const int*	xfb_data_result_lte = (const int*)xfb_data_result_lt + 2;  /* cast/non-cast cases */
	const int*	xfb_data_result_gt  = (const int*)xfb_data_result_lte + 2; /* cast/non-cast cases */
	const int*	xfb_data_result_gte = (const int*)xfb_data_result_gt + 2;  /* cast/non-cast cases */

	/* Prepare reference values */
	int					modifier;
	std::vector<double> reference1;
	std::vector<double> reference2;

	if (test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
	{
		modifier = 1;
	}
	else if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
			 test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION)
	{
		modifier = -1;
	}
	else
	{
		modifier = 0;
	}

	if (Utils::isMatrixVariableType(test_case.variable_type))
	{
		/* Matrices may be of different sizes so we need to compute the
		 * reference values separately for each matrix
		 */
		const Utils::_variable_type matrix_a_type = test_case.variable_type;
		const Utils::_variable_type matrix_b_type = Utils::getTransposedMatrixVariableType(test_case.variable_type);
		const unsigned int			n_matrix_a_components = Utils::getNumberOfComponentsForVariableType(matrix_a_type);
		const unsigned int			n_matrix_b_components = Utils::getNumberOfComponentsForVariableType(matrix_b_type);

		for (unsigned int n_component = 0; n_component < n_matrix_a_components; ++n_component)
		{
			reference1.push_back(modifier + n_component + 1);
		}

		for (unsigned int n_component = 0; n_component < n_matrix_b_components; ++n_component)
		{
			reference2.push_back(n_matrix_b_components - (n_component + 1));
		}
	} /* if (Utils::isMatrixVariableType(test_case.variable_type) */
	else
	{
		/* Generate as many components as will be expected for the result variable */
		for (unsigned int n_result_component = 0; n_result_component < n_result_components; ++n_result_component)
		{
			reference1.push_back(modifier + n_result_component + 1);
			reference2.push_back(n_result_components - (n_result_component + 1));
		}
	}

	/* Verify the result value(s) */
	if (test_case.operation_type == OPERATION_TYPE_MULTIPLICATION &&
		Utils::isMatrixVariableType(test_case.variable_type))
	{
		/* Matrix multiplication */
		double				  expected_result_data[4 * 4];
		Utils::_variable_type matrix_a_type = test_case.variable_type;
		Utils::_variable_type matrix_b_type = Utils::getTransposedMatrixVariableType(test_case.variable_type);

		getMatrixMultiplicationResult(matrix_a_type, reference1, matrix_b_type, reference2, expected_result_data);

		for (unsigned int n_component = 0; n_component < n_result_components; ++n_component)
		{
			if (de::abs(xfb_data_result[n_component] - expected_result_data[n_component]) > epsilon)
			{
				std::stringstream log_sstream;

				log_sstream << "Data returned for " << Utils::getVariableTypeString(matrix_a_type) << " * "
							<< Utils::getVariableTypeString(matrix_b_type)
							<< " matrix multiplication was incorrect; expected:(";

				for (unsigned int n_logged_component = 0; n_logged_component < n_result_components;
					 ++n_logged_component)
				{
					log_sstream << expected_result_data[n_logged_component];

					if (n_logged_component != (n_result_components - 1))
					{
						log_sstream << ", ";
					}
				} /* for (all components to be logged) */

				log_sstream << "), retrieved:(";

				for (unsigned int n_logged_component = 0; n_logged_component < n_result_components;
					 ++n_logged_component)
				{
					log_sstream << xfb_data_result[n_logged_component];

					if (n_logged_component != (n_result_components - 1))
					{
						log_sstream << ", ";
					}
				} /* for (all components to be logged) */

				log_sstream << ")";

				m_testCtx.getLog() << tcu::TestLog::Message << log_sstream.str().c_str() << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		} /* for (all result components) */
	}	 /* if (dealing with matrix multiplication) */
	else
	{
		for (unsigned int n_component = 0; n_component < n_result_components; ++n_component)
		{
			double expected_value = reference1[n_component];

			switch (test_case.operation_type)
			{
			case OPERATION_TYPE_ADDITION:
				expected_value += reference2[n_component];
				break;
			case OPERATION_TYPE_DIVISION:
				expected_value /= reference2[n_component];
				break;
			case OPERATION_TYPE_MULTIPLICATION:
				expected_value *= reference2[n_component];
				break;
			case OPERATION_TYPE_SUBTRACTION:
				expected_value -= reference2[n_component];
				break;

			case OPERATION_TYPE_PRE_DECREMENTATION:
			case OPERATION_TYPE_PRE_INCREMENTATION:
			{
				/* Modifier already applied */
				break;
			}

			case OPERATION_TYPE_POST_DECREMENTATION:
			case OPERATION_TYPE_POST_INCREMENTATION:
			{
				/* Need to reverse the modification for the purpose of the following check */
				expected_value -= modifier;

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized operation type");
			}
			} /* switch (test_case.operation_type) */

			if (de::abs(xfb_data_result[n_component] - expected_value) > epsilon)
			{
				std::string operation_type_string = getOperationTypeString(test_case.operation_type);
				std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

				m_testCtx.getLog() << tcu::TestLog::Message << "Value(s) generated for variable type ["
								   << variable_type_string << "]"
															  " and operation type ["
								   << operation_type_string << "]"
															   " were found invalid."
								   << tcu::TestLog::EndMessage;

				result = false;
				break;
			} /* if (test case failed) */
		}	 /* for (all components) */
	}

	/* Verify the comparison operation results */
	if (Utils::isScalarVariableType(test_case.variable_type))
	{
		DE_ASSERT(n_result_components == 1);

		const bool expected_result_lt[2]  = { reference1[0] < reference2[0], reference1[0] < (float)reference2[0] };
		const bool expected_result_lte[2] = { reference1[0] <= reference2[0], reference1[0] <= (float)reference2[0] };
		const bool expected_result_gt[2]  = { reference1[0] > reference2[0], reference1[0] > (float)reference2[0] };
		const bool expected_result_gte[2] = { reference1[0] >= reference2[0], reference1[0] >= (float)reference2[0] };

		if ((xfb_data_result_lt[0] ? 1 : 0) != expected_result_lt[0] ||
			(xfb_data_result_lt[1] ? 1 : 0) != expected_result_lt[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for lower-than operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_lte[0] ? 1 : 0) != expected_result_lte[0] ||
			(xfb_data_result_lte[1] ? 1 : 0) != expected_result_lte[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for lower-than-or-equal operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_gt[0] ? 1 : 0) != expected_result_gt[0] ||
			(xfb_data_result_gt[1] ? 1 : 0) != expected_result_gt[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for greater-than operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_gte[0] ? 1 : 0) != expected_result_gte[0] ||
			(xfb_data_result_gte[1] ? 1 : 0) != expected_result_gte[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Values reported for greater-than-or-equal operator used for "
								  "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* if (Utils::isScalarVariableType(test_case.variable_type) ) */
	else
	{
		if (xfb_data_result_lt[0] != 1 || xfb_data_result_lt[1] != 1 || xfb_data_result_lte[0] != 1 ||
			xfb_data_result_lte[1] != 1 || xfb_data_result_gt[0] != 1 || xfb_data_result_gt[1] != 1 ||
			xfb_data_result_gte[0] != 1 || xfb_data_result_gte[1] != 1)
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value was reported for matrix variable type, for which "
								  " operator checks are not executed; variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]" << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	return result;
}